

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O0

bool __thiscall stream::file::operator==(file *this,file *o)

{
  bool local_11;
  file *o_local;
  file *this_local;
  
  local_11 = false;
  if ((this->offset == o->offset) && (local_11 = false, this->size == o->size)) {
    local_11 = this->filter == o->filter;
  }
  return local_11;
}

Assistant:

bool file::operator==(const file & o) const {
	return (offset == o.offset
	        && size == o.size
	        && filter == o.filter);
}